

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturemanager.cpp
# Opt level: O1

FTexture * __thiscall
FTextureManager::FindTexture(FTextureManager *this,char *texname,int usetype,BITFIELD flags)

{
  FTextureID FVar1;
  FTexture *pFVar2;
  
  FVar1 = CheckForTexture(this,texname,usetype,flags);
  if (FVar1.texnum < 1) {
    pFVar2 = (FTexture *)0x0;
  }
  else {
    pFVar2 = (this->Textures).Array[(uint)FVar1.texnum].Texture;
  }
  return pFVar2;
}

Assistant:

FTexture *FTextureManager::FindTexture(const char *texname, int usetype, BITFIELD flags)
{
	FTextureID texnum = CheckForTexture (texname, usetype, flags);
	return !texnum.isValid()? NULL : Textures[texnum.GetIndex()].Texture;
}